

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atom.cpp
# Opt level: O3

void __thiscall Bracket::Bracket(Bracket *this,string *str,unsigned_long *pos)

{
  size_t *psVar1;
  byte bVar2;
  Bracket *this_00;
  _List_node_base *p_Var3;
  Symbol *this_01;
  string local_50;
  
  (this->super_Atom)._vptr_Atom = (_func_int **)&PTR__Bracket_00109c38;
  (this->func)._M_dataplus._M_p = (pointer)&(this->func).field_2;
  (this->func)._M_string_length = 0;
  (this->func).field_2._M_local_buf[0] = '\0';
  (this->para).super__List_base<Atom_*,_std::allocator<Atom_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->para;
  (this->para).super__List_base<Atom_*,_std::allocator<Atom_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->para;
  (this->para).super__List_base<Atom_*,_std::allocator<Atom_*>_>._M_impl._M_node._M_size = 0;
  if ((str->_M_dataplus)._M_p[*pos] != '(') {
    __assert_fail("str[pos] == \'(\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Fugoes[P]Final/src/Atom.cpp"
                  ,0x21,"Bracket::Bracket(const std::string &, unsigned long &)");
  }
  *pos = *pos + 1;
  getWord(&local_50,str,pos);
  std::__cxx11::string::operator=((string *)&this->func,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  do {
    while( true ) {
      bVar2 = (str->_M_dataplus)._M_p[*pos];
      if (0x1f < bVar2) break;
      if (bVar2 - 9 < 2) {
LAB_00102cd5:
        *pos = *pos + 1;
      }
      else {
LAB_00102ce2:
        this_01 = (Symbol *)operator_new(0x28);
        getWord(&local_50,str,pos);
        Symbol::Symbol(this_01,&local_50);
        p_Var3 = (_List_node_base *)operator_new(0x18);
        p_Var3[1]._M_next = (_List_node_base *)this_01;
        std::__detail::_List_node_base::_M_hook(p_Var3);
        psVar1 = &(this->para).super__List_base<Atom_*,_std::allocator<Atom_*>_>._M_impl._M_node.
                  _M_size;
        *psVar1 = *psVar1 + 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
    }
    if (bVar2 == 0x20) goto LAB_00102cd5;
    if (bVar2 != 0x28) {
      if (bVar2 == 0x29) {
        return;
      }
      goto LAB_00102ce2;
    }
    this_00 = (Bracket *)operator_new(0x40);
    Bracket(this_00,str,pos);
    p_Var3 = (_List_node_base *)operator_new(0x18);
    p_Var3[1]._M_next = (_List_node_base *)this_00;
    std::__detail::_List_node_base::_M_hook(p_Var3);
    psVar1 = &(this->para).super__List_base<Atom_*,_std::allocator<Atom_*>_>._M_impl._M_node._M_size
    ;
    *psVar1 = *psVar1 + 1;
    *pos = *pos + 1;
  } while( true );
}

Assistant:

Bracket::Bracket(const std::string &str, unsigned long &pos) {
    assert(str[pos] == '(');
    pos++;
    func = getWord(str, pos);
    Atom *temp;
    while (str[pos] != ')') {
        if (isBlank(str[pos])) {
            pos++;
        } else if (str[pos] == '(') {
            para.push_back(new Bracket(str, pos));
            pos++;
        } else {
            para.push_back(new Symbol(getWord(str, pos)));
        }
    }
}